

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O2

void __thiscall Perseus::PlanLeadOut(Perseus *this)

{
  _func_int *p_Var1;
  ostream *poVar2;
  PlanningUnit *pu;
  stringstream ss;
  allocator<char> local_209;
  string local_208;
  string local_1e8 [32];
  string local_1c8;
  undefined1 local_1a8 [392];
  
  p_Var1 = this->_vptr_Perseus[-3];
  std::__cxx11::string::string((string *)local_1a8,(string *)&this->_m_identification);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var1),(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  if (this->_m_storeTimings == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"POMDP",&local_209);
    pu = *(PlanningUnit **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
    if (pu == (PlanningUnit *)0x0) {
      pu = *(PlanningUnit **)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
    }
    directories::MADPGetResultsDir(&local_208,&local_1c8,pu);
    poVar2 = std::operator<<((ostream *)(local_1a8 + 0x10),(string *)&local_208);
    poVar2 = std::operator<<(poVar2,"/");
    std::__cxx11::string::string(local_1e8,(string *)&this->_m_identification);
    poVar2 = std::operator<<(poVar2,local_1e8);
    poVar2 = std::operator<<(poVar2,"Timings_h");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1c8);
    p_Var1 = this->_vptr_Perseus[-3];
    std::__cxx11::stringbuf::str();
    TimedAlgorithm::SaveTimers
              ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var1),&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if (0 < this->_m_verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Saved timing results to ");
      std::__cxx11::stringbuf::str();
      poVar2 = std::operator<<(poVar2,(string *)&local_208);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  }
  return;
}

Assistant:

void Perseus::PlanLeadOut()
{
    StopTimer(GetIdentification());
    if(_m_storeTimings)
    {
        stringstream ss;
        ss << directories::MADPGetResultsDir("POMDP",GetPU()) << "/"
           << GetIdentification() << "Timings_h" << GetPU()->GetHorizon();
        SaveTimers(ss.str());
        if(GetVerbose() >= 1)
            cout << "Saved timing results to " << ss.str() << endl;
    }
}